

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O3

void asio::detail::executor_function::
     complete<asio::detail::binder1<std::_Bind<void(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener*,std::shared_ptr<nuraft::asio_rpc_listener>,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>,std::error_code>,std::allocator<void>>
               (impl_base *base,bool call)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  allocator<void> allocator;
  ptr p;
  allocator<void> local_79;
  _func_void_impl_base_ptr_bool *local_78;
  _func_void_impl_base_ptr_bool *p_Stack_70;
  _func_void_impl_base_ptr_bool *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  _func_void_impl_base_ptr_bool *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _func_void_impl_base_ptr_bool *local_48;
  _func_void_impl_base_ptr_bool *local_40;
  _func_void_impl_base_ptr_bool *p_Stack_38;
  ptr local_28;
  
  local_28.a = &local_79;
  local_78 = base[1].complete_;
  p_Stack_70 = base[2].complete_;
  local_68 = base[3].complete_;
  p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[4].complete_;
  base[4].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  base[3].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  local_58 = base[5].complete_;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[6].complete_;
  base[6].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  base[5].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  local_48 = base[7].complete_;
  local_40 = base[8].complete_;
  p_Stack_38 = base[9].complete_;
  local_50 = this;
  local_28.v = base;
  local_28.p = (impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
                *)base;
  impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_28);
  if (call) {
    std::
    __invoke_impl<void,void(nuraft::asio_rpc_listener::*&)(std::shared_ptr<nuraft::asio_rpc_listener>,std::shared_ptr<nuraft::rpc_session>,std::error_code_const&),nuraft::asio_rpc_listener*&,std::shared_ptr<nuraft::asio_rpc_listener>&,std::shared_ptr<nuraft::rpc_session>&,std::error_code_const&>
              (&local_78,&local_48,&local_58,&local_68,&local_40);
    this = local_50;
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
  }
  impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>,_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_28);
  return;
}

Assistant:

static void complete(impl_base* base, bool call)
  {
    // Take ownership of the function object.
    impl<Function, Alloc>* i(static_cast<impl<Function, Alloc>*>(base));
    Alloc allocator(i->allocator_);
    typename impl<Function, Alloc>::ptr p = {
      detail::addressof(allocator), i, i };

    // Make a copy of the function so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the function may be the true owner of the memory
    // associated with the function. Consequently, a local copy of the function
    // is required to ensure that any owning sub-object remains valid until
    // after we have deallocated the memory here.
    Function function(ASIO_MOVE_CAST(Function)(i->function_));
    p.reset();

    // Make the upcall if required.
    if (call)
    {
      asio_handler_invoke_helpers::invoke(function, function);
    }
  }